

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdAdaptEcdsaAdaptor(void *handle,char *adaptor_signature,char *adaptor_secret,char **signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ByteData sig;
  allocator local_c2;
  allocator local_c1;
  undefined1 local_c0 [32];
  AdaptorSignature local_a0;
  ByteData local_88;
  string local_70;
  Privkey local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    local_c0._0_8_ = "cfdcapi_key.cpp";
    local_c0._8_4_ = 0x115;
    local_c0._16_8_ = "CfdAdaptEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,
               "adaptor_signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Failed to parameter. adaptor_signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor_secret);
  if (!bVar1) {
    if (signature != (char **)0x0) {
      std::__cxx11::string::string((string *)local_c0,adaptor_signature,&local_c1);
      cfd::core::AdaptorSignature::AdaptorSignature(&local_a0,(string *)local_c0);
      std::__cxx11::string::string((string *)&local_70,adaptor_secret,&local_c2);
      cfd::core::Privkey::Privkey(&local_50,&local_70,kMainnet,true);
      cfd::core::AdaptorUtil::Adapt(&local_88,&local_a0,&local_50);
      if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_);
      }
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_c0,&local_88);
      pcVar2 = cfd::capi::CreateString((string *)local_c0);
      *signature = pcVar2;
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_);
      }
      if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_c0._0_8_ = "cfdcapi_key.cpp";
    local_c0._8_4_ = 0x121;
    local_c0._16_8_ = "CfdAdaptEcdsaAdaptor";
    cfd::core::logger::log<>((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"signature is null.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Failed to parameter. signature is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_c0._0_8_ = "cfdcapi_key.cpp";
  local_c0._8_4_ = 0x11b;
  local_c0._16_8_ = "CfdAdaptEcdsaAdaptor";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"adaptor_secret is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Failed to parameter. adaptor_secret is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAdaptEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* adaptor_secret,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(adaptor_secret)) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    ByteData sig = AdaptorUtil::Adapt(
        AdaptorSignature(adaptor_signature), Privkey(adaptor_secret));

    *signature = CreateString(sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}